

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ModuleCloner.h
# Opt level: O2

InputDeclaration * __thiscall
soul::ModuleCloner::getRemappedInput(ModuleCloner *this,InputDeclaration *old)

{
  mapped_type *this_00;
  InputDeclaration *pIVar1;
  key_type local_8;
  
  local_8.object = old;
  this_00 = std::__detail::
            _Map_base<soul::pool_ref<const_soul::heart::InputDeclaration>,_std::pair<const_soul::pool_ref<const_soul::heart::InputDeclaration>,_soul::pool_ptr<soul::heart::InputDeclaration>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::InputDeclaration>,_soul::pool_ptr<soul::heart::InputDeclaration>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<const_soul::heart::InputDeclaration>_>,_std::hash<soul::pool_ref<const_soul::heart::InputDeclaration>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<soul::pool_ref<const_soul::heart::InputDeclaration>,_std::pair<const_soul::pool_ref<const_soul::heart::InputDeclaration>,_soul::pool_ptr<soul::heart::InputDeclaration>_>,_std::allocator<std::pair<const_soul::pool_ref<const_soul::heart::InputDeclaration>,_soul::pool_ptr<soul::heart::InputDeclaration>_>_>,_std::__detail::_Select1st,_std::equal_to<soul::pool_ref<const_soul::heart::InputDeclaration>_>,_std::hash<soul::pool_ref<const_soul::heart::InputDeclaration>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->inputMappings,&local_8);
  pIVar1 = pool_ptr<soul::heart::InputDeclaration>::operator*(this_00);
  return pIVar1;
}

Assistant:

heart::InputDeclaration& getRemappedInput (heart::InputDeclaration& old)    { return *inputMappings[old]; }